

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O0

void __thiscall
PGSStreamReader::setBuffer(PGSStreamReader *this,uint8_t *data,uint32_t dataLen,bool lastBlock)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  uchar *puVar4;
  bool lastBlock_local;
  uint32_t dataLen_local;
  uint8_t *data_local;
  PGSStreamReader *this_local;
  
  lVar1 = (this->super_AbstractStreamReader).m_tmpBufferLen;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_tmpBuffer);
  if ((long)sVar3 < (long)(lVar1 + (ulong)dataLen)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->m_tmpBuffer,(this->super_AbstractStreamReader).m_tmpBufferLen + (ulong)dataLen
              );
  }
  bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->m_tmpBuffer);
  if (!bVar2) {
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->m_tmpBuffer);
    memmove(puVar4 + (this->super_AbstractStreamReader).m_tmpBufferLen,data + 0x8000,(ulong)dataLen)
    ;
  }
  (this->super_AbstractStreamReader).m_tmpBufferLen =
       (ulong)dataLen + (this->super_AbstractStreamReader).m_tmpBufferLen;
  bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->m_tmpBuffer);
  if (bVar2) {
    (this->super_AbstractStreamReader).m_buffer = (uint8_t *)0x0;
    (this->super_AbstractStreamReader).m_curPos = (uint8_t *)0x0;
  }
  else {
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->m_tmpBuffer);
    (this->super_AbstractStreamReader).m_buffer = puVar4;
    (this->super_AbstractStreamReader).m_curPos = puVar4;
  }
  (this->super_AbstractStreamReader).m_bufEnd =
       (this->super_AbstractStreamReader).m_buffer +
       (this->super_AbstractStreamReader).m_tmpBufferLen;
  (this->super_AbstractStreamReader).m_tmpBufferLen = 0;
  return;
}

Assistant:

void PGSStreamReader::setBuffer(uint8_t* data, const uint32_t dataLen, bool lastBlock)
{
    if (m_tmpBufferLen + dataLen > static_cast<int64_t>(m_tmpBuffer.size()))
        m_tmpBuffer.resize(m_tmpBufferLen + dataLen);

    if (!m_tmpBuffer.empty())
        memmove(m_tmpBuffer.data() + m_tmpBufferLen, data + MAX_AV_PACKET_SIZE, dataLen);
    m_tmpBufferLen += dataLen;

    if (!m_tmpBuffer.empty())
        m_curPos = m_buffer = m_tmpBuffer.data();
    else
        m_curPos = m_buffer = nullptr;
    m_bufEnd = m_buffer + m_tmpBufferLen;
    m_tmpBufferLen = 0;
}